

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_3dVector * __thiscall ON_3dVector::operator=(ON_3dVector *this,float *v)

{
  if (v != (float *)0x0) {
    this->x = (double)*v;
    this->y = (double)v[1];
    this->z = (double)v[2];
    return this;
  }
  this->x = 0.0;
  this->y = 0.0;
  this->z = 0.0;
  return this;
}

Assistant:

ON_3dVector& ON_3dVector::operator=(const float* v)
{
  if ( v ) {
    x = (double)v[0];
    y = (double)v[1];
    z = (double)v[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}